

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GofRAngle.cpp
# Opt level: O2

void __thiscall OpenMD::GofRAngle::processHistogram(GofRAngle *this)

{
  int iVar1;
  pointer pvVar2;
  pointer pvVar3;
  long lVar4;
  pointer piVar5;
  pointer pvVar6;
  long lVar7;
  uint uVar8;
  ulong uVar9;
  uint uVar10;
  ulong uVar11;
  RealType RVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  
  iVar1 = (this->super_RadialDistrFunc).nPairs_;
  RVar12 = Snapshot::getVolume(((this->super_RadialDistrFunc).super_StaticAnalyser.info_)->sman_->
                               currentSnapshot_);
  pvVar2 = (this->histogram_).
           super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pvVar3 = (this->histogram_).
           super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  dVar13 = 0.0;
  for (uVar8 = 0; uVar9 = (ulong)uVar8, uVar9 < (ulong)(((long)pvVar3 - (long)pvVar2) / 0x18);
      uVar8 = uVar8 + 1) {
    dVar15 = this->deltaR_ * dVar13;
    dVar14 = this->deltaR_ + dVar15;
    lVar4 = *(long *)&pvVar2[uVar9].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data;
    piVar5 = *(pointer *)
              ((long)&pvVar2[uVar9].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data + 8);
    pvVar6 = (this->avgGofr_).
             super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    for (uVar10 = 0; uVar11 = (ulong)uVar10, uVar11 < (ulong)((long)piVar5 - lVar4 >> 2);
        uVar10 = uVar10 + 1) {
      lVar7 = *(long *)&pvVar6[uVar9].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data;
      *(double *)(lVar7 + uVar11 * 8) =
           (double)*(int *)(lVar4 + uVar11 * 4) /
           ((dVar14 * dVar14 * dVar14 - dVar15 * dVar15 * dVar15) *
           ((((double)iVar1 / RVar12) * 12.566370614359172) / 3.0)) +
           *(double *)(lVar7 + uVar11 * 8);
    }
    dVar13 = dVar13 + 1.0;
  }
  return;
}

Assistant:

void GofRAngle::processHistogram() {
    int nPairs = getNPairs();
    RealType volume =
        info_->getSnapshotManager()->getCurrentSnapshot()->getVolume();
    RealType pairDensity  = nPairs / volume;
    RealType pairConstant = (4.0 * Constants::PI * pairDensity) / 3.0;

    for (unsigned int i = 0; i < histogram_.size(); ++i) {
      RealType rLower = i * deltaR_;
      RealType rUpper = rLower + deltaR_;
      RealType volSlice =
          (rUpper * rUpper * rUpper) - (rLower * rLower * rLower);
      RealType nIdeal = volSlice * pairConstant;

      for (unsigned int j = 0; j < histogram_[i].size(); ++j) {
        avgGofr_[i][j] += histogram_[i][j] / nIdeal;
      }
    }
  }